

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O0

string * ReplaceOrigin(string *__return_storage_ptr__,string *rpath,string *origin)

{
  RegularExpressionMatch *pRVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [8];
  string end_1;
  string begin_1;
  undefined1 local_118 [8];
  string end;
  string begin;
  RegularExpressionMatch match;
  string *origin_local;
  string *rpath_local;
  
  if (ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::originRegex == '\0') {
    iVar3 = __cxa_guard_acquire(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                 ::originRegex);
    if (iVar3 != 0) {
      cmsys::RegularExpression::RegularExpression
                (&ReplaceOrigin::originRegex,"(\\$ORIGIN)([^a-zA-Z0-9_]|$)");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ReplaceOrigin::originRegex,
                   &__dso_handle);
      __cxa_guard_release(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                           originRegex);
    }
  }
  if (ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::originCurlyRegex ==
      '\0') {
    iVar3 = __cxa_guard_acquire(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                 ::originCurlyRegex);
    if (iVar3 != 0) {
      cmsys::RegularExpression::RegularExpression(&ReplaceOrigin::originCurlyRegex,"\\${ORIGIN}");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ReplaceOrigin::originCurlyRegex,
                   &__dso_handle);
      __cxa_guard_release(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                           originCurlyRegex);
    }
  }
  cmsys::RegularExpressionMatch::RegularExpressionMatch
            ((RegularExpressionMatch *)((long)&begin.field_2 + 8));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmsys::RegularExpression::find
                    (&ReplaceOrigin::originRegex,pcVar4,
                     (RegularExpressionMatch *)((long)&begin.field_2 + 8));
  if (bVar2) {
    pRVar1 = (RegularExpressionMatch *)((long)&begin.field_2 + 8);
    cmsys::RegularExpressionMatch::start(pRVar1,1);
    std::__cxx11::string::substr((ulong)((long)&end.field_2 + 8),(ulong)rpath);
    cmsys::RegularExpressionMatch::end(pRVar1,1);
    std::__cxx11::string::substr((ulong)local_118,(ulong)rpath);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&begin_1.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&end.field_2 + 8),origin);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&begin_1.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    std::__cxx11::string::~string((string *)(begin_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)(end.field_2._M_local_buf + 8));
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::RegularExpression::find
                      (&ReplaceOrigin::originCurlyRegex,pcVar4,
                       (RegularExpressionMatch *)((long)&begin.field_2 + 8));
    if (bVar2) {
      pRVar1 = (RegularExpressionMatch *)((long)&begin.field_2 + 8);
      cmsys::RegularExpressionMatch::start(pRVar1);
      std::__cxx11::string::substr((ulong)((long)&end_1.field_2 + 8),(ulong)rpath);
      cmsys::RegularExpressionMatch::end(pRVar1);
      std::__cxx11::string::substr((ulong)local_178,(ulong)rpath);
      std::operator+(&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&end_1.field_2 + 8),origin);
      std::operator+(__return_storage_ptr__,&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178)
      ;
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)local_178);
      std::__cxx11::string::~string((string *)(end_1.field_2._M_local_buf + 8));
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)rpath);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string ReplaceOrigin(const std::string& rpath,
                                 const std::string& origin)
{
  static const cmsys::RegularExpression originRegex(
    "(\\$ORIGIN)([^a-zA-Z0-9_]|$)");
  static const cmsys::RegularExpression originCurlyRegex("\\${ORIGIN}");

  cmsys::RegularExpressionMatch match;
  if (originRegex.find(rpath.c_str(), match)) {
    std::string begin = rpath.substr(0, match.start(1));
    std::string end = rpath.substr(match.end(1));
    return begin + origin + end;
  }
  if (originCurlyRegex.find(rpath.c_str(), match)) {
    std::string begin = rpath.substr(0, match.start());
    std::string end = rpath.substr(match.end());
    return begin + origin + end;
  }
  return rpath;
}